

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd_huffman.c
# Opt level: O1

int nghttp2_hd_huff_encode(nghttp2_bufs *bufs,uint8_t *src,size_t srclen)

{
  uint8_t **ppuVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  
  uVar3 = (long)(bufs->cur->buf).end - (long)(bufs->cur->buf).last;
  pbVar8 = src + srclen;
  uVar6 = 0;
  uVar7 = 0;
  while (src != pbVar8) {
    bVar5 = *src;
    src = src + 1;
    uVar6 = uVar6 | (ulong)huff_sym_table[bVar5].code << (-((char)uVar7 + ' ') & 0x3fU);
    uVar7 = uVar7 + huff_sym_table[bVar5].nbits;
    if (0x1f < uVar7) {
      if (uVar3 < 4) {
        do {
          iVar2 = nghttp2_bufs_addb(bufs,(uint8_t)(uVar6 >> 0x38));
          if (iVar2 != 0) {
            return iVar2;
          }
          uVar6 = uVar6 << 8;
          uVar7 = uVar7 - 8;
        } while (7 < uVar7);
        uVar3 = (long)(bufs->cur->buf).end - (long)(bufs->cur->buf).last;
      }
      else {
        uVar4 = (uint)(uVar6 >> 0x20);
        *(uint *)(bufs->cur->buf).last =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        ppuVar1 = &(bufs->cur->buf).last;
        *ppuVar1 = *ppuVar1 + 4;
        uVar3 = uVar3 - 4;
        uVar6 = uVar6 << 0x20;
        uVar7 = uVar7 - 0x20;
      }
    }
  }
  while( true ) {
    bVar5 = (byte)(uVar6 >> 0x38);
    if (uVar7 < 8) {
      if ((uVar7 == 0) ||
         (iVar2 = nghttp2_bufs_addb(bufs,~(byte)(-1 << (8U - (char)uVar7 & 0x1f)) | bVar5),
         iVar2 == 0)) {
        iVar2 = 0;
      }
      return iVar2;
    }
    iVar2 = nghttp2_bufs_addb(bufs,bVar5);
    if (iVar2 != 0) break;
    uVar6 = uVar6 << 8;
    uVar7 = uVar7 - 8;
  }
  return iVar2;
}

Assistant:

int nghttp2_hd_huff_encode(nghttp2_bufs *bufs, const uint8_t *src,
                           size_t srclen) {
  const nghttp2_huff_sym *sym;
  const uint8_t *end = src + srclen;
  uint64_t code = 0;
  uint32_t x;
  size_t nbits = 0;
  size_t avail;
  int rv;

  avail = nghttp2_bufs_cur_avail(bufs);

  for (; src != end;) {
    sym = &huff_sym_table[*src++];
    code |= (uint64_t)sym->code << (32 - nbits);
    nbits += sym->nbits;
    if (nbits < 32) {
      continue;
    }
    if (avail >= 4) {
      x = htonl((uint32_t)(code >> 32));
      memcpy(bufs->cur->buf.last, &x, 4);
      bufs->cur->buf.last += 4;
      avail -= 4;
      code <<= 32;
      nbits -= 32;
      continue;
    }

    for (; nbits >= 8;) {
      rv = nghttp2_bufs_addb(bufs, (uint8_t)(code >> 56));
      if (rv != 0) {
        return rv;
      }
      code <<= 8;
      nbits -= 8;
    }

    avail = nghttp2_bufs_cur_avail(bufs);
  }

  for (; nbits >= 8;) {
    rv = nghttp2_bufs_addb(bufs, (uint8_t)(code >> 56));
    if (rv != 0) {
      return rv;
    }
    code <<= 8;
    nbits -= 8;
  }

  if (nbits) {
    rv = nghttp2_bufs_addb(
        bufs, (uint8_t)((uint8_t)(code >> 56) | ((1 << (8 - nbits)) - 1)));
    if (rv != 0) {
      return rv;
    }
  }

  return 0;
}